

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGLDriver::createMaterialRenderers(COpenGLDriver *this)

{
  COpenGLDriver *d;
  CNullDriver *this_00;
  CNullDriver *in_stack_ffffffffffffffd0;
  
  d = (COpenGLDriver *)operator_new(0x28);
  COpenGLMaterialRenderer_SOLID::COpenGLMaterialRenderer_SOLID
            ((COpenGLMaterialRenderer_SOLID *)in_stack_ffffffffffffffd0,d);
  CNullDriver::addAndDropMaterialRenderer(in_stack_ffffffffffffffd0,(IMaterialRenderer *)d);
  this_00 = (CNullDriver *)operator_new(0x28);
  COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL::
  COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL
            ((COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL *)this_00,d);
  CNullDriver::addAndDropMaterialRenderer(this_00,(IMaterialRenderer *)d);
  operator_new(0x28);
  COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF::
  COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF
            ((COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF *)this_00,d);
  CNullDriver::addAndDropMaterialRenderer(this_00,(IMaterialRenderer *)d);
  operator_new(0x28);
  COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA::COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA
            ((COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA *)this_00,d);
  CNullDriver::addAndDropMaterialRenderer(this_00,(IMaterialRenderer *)d);
  operator_new(0x28);
  COpenGLMaterialRenderer_ONETEXTURE_BLEND::COpenGLMaterialRenderer_ONETEXTURE_BLEND
            ((COpenGLMaterialRenderer_ONETEXTURE_BLEND *)this_00,d);
  CNullDriver::addAndDropMaterialRenderer(this_00,(IMaterialRenderer *)d);
  return;
}

Assistant:

void COpenGLDriver::createMaterialRenderers()
{
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_SOLID(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_ONETEXTURE_BLEND(this));
}